

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# target.c
# Opt level: O0

int stumpless_trace_message_str
              (stumpless_target *target,char *file,int line,char *func,char *message)

{
  char *message_local;
  char *func_local;
  int line_local;
  char *file_local;
  stumpless_target *target_local;
  
  if (target == (stumpless_target *)0x0) {
    raise_argument_empty("target was NULL");
    target_local._4_4_ = -1;
  }
  else {
    target_local._4_4_ =
         stumpless_trace_log_str(target,target->default_prival,file,line,func,message);
  }
  return target_local._4_4_;
}

Assistant:

int
stumpless_trace_message_str( struct stumpless_target *target,
                             const char *file,
                             int line,
                             const char *func,
                             const char *message ) {
  VALIDATE_ARG_NOT_NULL_INT_RETURN( target );

  return stumpless_trace_log_str( target,
                                  target->default_prival,
                                  file,
                                  line,
                                  func,
                                  message );
}